

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::MemPass::IsTargetType(MemPass *this,Instruction *typeInst)

{
  bool bVar1;
  Op OVar2;
  uint32_t id;
  DefUseManager *this_00;
  Instruction *pIVar3;
  anon_class_8_1_8991fb9c local_48;
  function<bool_(const_unsigned_int_*)> local_40;
  Instruction *local_20;
  Instruction *typeInst_local;
  MemPass *this_local;
  
  local_20 = typeInst;
  typeInst_local = (Instruction *)this;
  bVar1 = IsBaseTargetType(this,typeInst);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    OVar2 = Instruction::opcode(local_20);
    if (OVar2 == OpTypeArray) {
      this_00 = Pass::get_def_use_mgr(&this->super_Pass);
      id = Instruction::GetSingleWordOperand(local_20,1);
      pIVar3 = analysis::DefUseManager::GetDef(this_00,id);
      bVar1 = IsTargetType(this,pIVar3);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      OVar2 = Instruction::opcode(local_20);
      pIVar3 = local_20;
      if (OVar2 == OpTypeStruct) {
        local_48.this = this;
        std::function<bool(unsigned_int_const*)>::
        function<spvtools::opt::MemPass::IsTargetType(spvtools::opt::Instruction_const*)const::__0,void>
                  ((function<bool(unsigned_int_const*)> *)&local_40,&local_48);
        this_local._7_1_ = Instruction::WhileEachInId(pIVar3,&local_40);
        std::function<bool_(const_unsigned_int_*)>::~function(&local_40);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MemPass::IsTargetType(const Instruction* typeInst) const {
  if (IsBaseTargetType(typeInst)) return true;
  if (typeInst->opcode() == spv::Op::OpTypeArray) {
    if (!IsTargetType(
            get_def_use_mgr()->GetDef(typeInst->GetSingleWordOperand(1)))) {
      return false;
    }
    return true;
  }
  if (typeInst->opcode() != spv::Op::OpTypeStruct) return false;
  // All struct members must be math type
  return typeInst->WhileEachInId([this](const uint32_t* tid) {
    Instruction* compTypeInst = get_def_use_mgr()->GetDef(*tid);
    if (!IsTargetType(compTypeInst)) return false;
    return true;
  });
}